

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

bool s2textformat::MakeCellUnion(string_view str,S2CellUnion *cell_union)

{
  bool bVar1;
  S2CellId *cell_id_00;
  char in_R8B;
  string_view str_00;
  string_view str_01;
  vector<S2CellId,_std::allocator<S2CellId>_> local_100;
  S2CellUnion local_e8;
  s2textformat *local_c8;
  char *pcStack_c0;
  S2CellId local_b0;
  S2CellId cell_id;
  string_view *cell_str;
  __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
  local_98;
  iterator __end1;
  iterator __begin1;
  vector<absl::string_view,_std::allocator<absl::string_view>_> local_60;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *local_48;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *__range1;
  vector<S2CellId,_std::allocator<S2CellId>_> cell_ids;
  S2CellUnion *cell_union_local;
  string_view str_local;
  
  cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)cell_union;
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)&__range1);
  str_01.length_ = 0x2c;
  str_01.ptr_ = (char *)str.length_;
  cell_id_00 = (S2CellId *)0x2c;
  SplitString(&local_60,(s2textformat *)str.ptr_,str_01,in_R8B);
  local_48 = &local_60;
  __end1 = std::vector<absl::string_view,_std::allocator<absl::string_view>_>::begin(local_48);
  local_98._M_current =
       (string_view *)
       std::vector<absl::string_view,_std::allocator<absl::string_view>_>::end(local_48);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end1,&local_98);
    if (!bVar1) {
      cell_str._4_4_ = 2;
LAB_0050e3ce:
      std::vector<absl::string_view,_std::allocator<absl::string_view>_>::~vector(&local_60);
      if (cell_str._4_4_ == 2) {
        std::vector<S2CellId,_std::allocator<S2CellId>_>::vector
                  (&local_100,(vector<S2CellId,_std::allocator<S2CellId>_> *)&__range1);
        S2CellUnion::S2CellUnion(&local_e8,&local_100);
        S2CellUnion::operator=
                  ((S2CellUnion *)
                   cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,&local_e8);
        S2CellUnion::~S2CellUnion(&local_e8);
        std::vector<S2CellId,_std::allocator<S2CellId>_>::~vector(&local_100);
        str_local.length_._7_1_ = 1;
      }
      std::vector<S2CellId,_std::allocator<S2CellId>_>::~vector
                ((vector<S2CellId,_std::allocator<S2CellId>_> *)&__range1);
      return (bool)(str_local.length_._7_1_ & 1);
    }
    cell_id.id_ = (uint64)__gnu_cxx::
                          __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
                          ::operator*(&__end1);
    S2CellId::S2CellId(&local_b0);
    local_c8 = *(s2textformat **)cell_id.id_;
    pcStack_c0 = *(char **)(cell_id.id_ + 8);
    str_00.length_ = (size_type)&local_b0;
    str_00.ptr_ = pcStack_c0;
    bVar1 = MakeCellId(local_c8,str_00,cell_id_00);
    if (!bVar1) {
      str_local.length_._7_1_ = 0;
      cell_str._4_4_ = 1;
      goto LAB_0050e3ce;
    }
    std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back
              ((vector<S2CellId,_std::allocator<S2CellId>_> *)&__range1,&local_b0);
    __gnu_cxx::
    __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool MakeCellUnion(string_view str, S2CellUnion* cell_union) {
  vector<S2CellId> cell_ids;
  for (const auto& cell_str : SplitString(str, ',')) {
    S2CellId cell_id;
    if (!MakeCellId(cell_str, &cell_id)) return false;
    cell_ids.push_back(cell_id);
  }
  *cell_union = S2CellUnion(std::move(cell_ids));
  return true;
}